

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O1

void __thiscall
embree::cache_regression_test::thread_alloc(cache_regression_test *this,cache_regression_test *This)

{
  atomic<int> *paVar1;
  long *plVar2;
  ulong *puVar3;
  long lVar4;
  int *piVar5;
  ulong extraout_RAX;
  ulong uVar6;
  int *unaff_RBP;
  size_t j;
  uint uVar7;
  ulong *puVar8;
  bool bVar9;
  size_t N;
  size_t elt;
  ulong local_70;
  ulong local_68;
  BarrierSys *local_60;
  CacheEntry *local_58;
  ulong local_50;
  ulong local_48;
  anon_class_16_2_fa5d65c8 local_40;
  
  LOCK();
  paVar1 = &this->threadIDCounter;
  local_48 = (ulong)(uint)(paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_50 = DAT_022365c0 >> 2;
  local_60 = &this->barrier;
  BarrierSys::wait(local_60,This);
  local_58 = this->entry;
  lVar4 = __tls_get_addr(&PTR_02223e08);
  plVar2 = (long *)(lVar4 + 8);
  lVar4 = 0;
  do {
    uVar7 = (int)lVar4 + (int)local_48 & 0xfff;
    local_68 = (ulong)uVar7;
    local_70 = (local_68 % 1000) * 10 + 1;
    if (local_50 <= local_70) {
      local_70 = local_50;
    }
    local_40.N = &local_70;
    local_40.elt = &local_68;
    if (*plVar2 == 0) {
      SharedLazyTessellationCache::getNextRenderThreadWorkState
                ((SharedLazyTessellationCache *)
                 &SharedLazyTessellationCache::sharedLazyTessellationCache);
    }
    puVar8 = (ulong *)((long)&(local_58->tag).data.super_atomic<long>.super___atomic_base<long>._M_i
                      + (ulong)(uVar7 << 4));
    puVar3 = (ulong *)*plVar2;
LAB_00e3adf5:
    do {
      LOCK();
      uVar6 = *puVar3;
      *puVar3 = *puVar3 + 1;
      UNLOCK();
      if (3 < uVar6) {
        This = (cache_regression_test *)(ulong)(3 < uVar6);
        thread_alloc();
        if ((extraout_RAX & 1) != 0) goto LAB_00e3adf5;
      }
      uVar6 = *puVar8;
      if ((uVar6 == 0) ||
         (piVar5 = (int *)((uVar6 & 0xffffffffff) +
                          SharedLazyTessellationCache::sharedLazyTessellationCache),
         ((long)uVar6 >> 0x28) + 7U < DAT_022364c0)) {
        piVar5 = (int *)0x0;
      }
      if (piVar5 == (int *)0x0) {
        if ((puVar8[1] & 1) == 0) {
          LOCK();
          bVar9 = (char)puVar8[1] == '\0';
          if (bVar9) {
            *(char *)(puVar8 + 1) = '\x01';
          }
          UNLOCK();
          if (bVar9) {
            if ((*puVar8 == 0) || (((long)*puVar8 >> 0x28) + 7U < DAT_022364c0)) {
              unaff_RBP = thread_alloc::anon_class_16_2_fa5d65c8::operator()(&local_40);
              uVar6 = DAT_022364c0 << 0x28 |
                      (long)unaff_RBP - SharedLazyTessellationCache::sharedLazyTessellationCache;
              if (unaff_RBP == (int *)0x0) {
                uVar6 = 0;
              }
              LOCK();
              *puVar8 = uVar6;
              UNLOCK();
              *(undefined1 *)(puVar8 + 1) = 0;
              bVar9 = false;
              goto LAB_00e3aebe;
            }
            *(undefined1 *)(puVar8 + 1) = 0;
          }
        }
        LOCK();
        *puVar3 = *puVar3 - 1;
        UNLOCK();
        bVar9 = true;
      }
      else {
        bVar9 = false;
        unaff_RBP = piVar5;
      }
LAB_00e3aebe:
    } while (bVar9);
    if (unaff_RBP == (int *)0x0) {
      if (*plVar2 == 0) {
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
      }
      LOCK();
      *(long *)*plVar2 = *(long *)*plVar2 + -1;
      UNLOCK();
      LOCK();
      (this->numFailed).super___atomic_base<unsigned_long>._M_i =
           (this->numFailed).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    else {
      if (local_70 != 0) {
        uVar6 = 0;
        do {
          This = (cache_regression_test *)(ulong)(uint)unaff_RBP[uVar6];
          if (unaff_RBP[uVar6] != (uint)local_68) {
            LOCK();
            (this->numFailed).super___atomic_base<unsigned_long>._M_i =
                 (this->numFailed).super___atomic_base<unsigned_long>._M_i + 1;
            UNLOCK();
            break;
          }
          uVar6 = uVar6 + 1;
        } while (local_70 != uVar6);
      }
      if (*plVar2 == 0) {
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
      }
      LOCK();
      *(long *)*plVar2 = *(long *)*plVar2 + -1;
      UNLOCK();
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 100000) {
      BarrierSys::wait(local_60,This);
      return;
    }
  } while( true );
}

Assistant:

static void thread_alloc(cache_regression_test* This)
    {
      int threadID = This->threadIDCounter++;
      size_t maxN = SharedLazyTessellationCache::sharedLazyTessellationCache.maxAllocSize()/4;
      This->barrier.wait();

      for (size_t j=0; j<100000; j++)
      {
        size_t elt = (threadID+j)%numEntries;
        size_t N = min(1+10*(elt%1000),maxN);
          
        volatile int* data = (volatile int*) SharedLazyTessellationCache::lookup(This->entry[elt],0,[&] () {
            int* data = (int*) SharedLazyTessellationCache::sharedLazyTessellationCache.malloc(4*N);
            for (size_t k=0; k<N; k++) data[k] = (int)elt;
            return data;
          });
        
        if (data == nullptr) {
          SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
          This->numFailed++;
          continue;
        }
            
        /* check memory block */
        for (size_t k=0; k<N; k++) {
          if (data[k] != (int)elt) {
            This->numFailed++;
            break;
          }
        }
        
        SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
      }
      This->barrier.wait();
    }